

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

optional<helics::MessageProcessingResult> __thiscall
helics::FederateState::checkProcResult
          (FederateState *this,
          tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *proc_result,
          ActionMessage *cmd)

{
  string *this_00;
  FederateStates newState;
  TimeCoordinator *pTVar1;
  long lVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  MessageProcessingResult MVar5;
  int iVar7;
  char *pcVar8;
  ushort uVar9;
  char *in_R9;
  string_view logMessageSource;
  string_view logMessageSource_00;
  string_view fmt;
  string_view logMessageSource_01;
  string_view fmt_00;
  string_view logMessageSource_02;
  string_view message;
  string_view message_00;
  format_args args;
  string_view message_01;
  format_args args_00;
  string_view message_02;
  size_type sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  ushort uVar6;
  
  this->timeGranted_mode =
       (proc_result->
       super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
       super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.super__Tuple_impl<2UL,_bool>.
       super__Head_base<2UL,_bool,_false>._M_head_impl;
  newState = (proc_result->
             super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
             super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl;
  if ((this->state)._M_i != newState) {
    setState(this,newState);
    switch((proc_result->
           super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
           super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl) {
    case INITIALIZING:
      if (0xe < this->maxLogLevel) {
        logMessageSource._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
        logMessageSource._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        message._M_str = "Granting Initialization";
        message._M_len = 0x17;
        in_R9 = "Granting Initialization";
        logMessage(this,0xf,logMessageSource,message,false);
      }
      iVar7 = checkInterfaces(this);
      if (iVar7 != 0) {
        uVar9 = 0x100;
        uVar6 = 7;
        if ((this->state)._M_i != ERRORED) {
          LOCK();
          (this->state)._M_i = ERRORED;
          UNLOCK();
        }
        goto LAB_0026595a;
      }
      TimeCoordinator::enterInitialization
                ((this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
      break;
    case EXECUTING:
      (**(code **)((long)(((this->timeCoord)._M_t.
                           super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                           .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                         super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x10))();
      if (0xe < this->maxLogLevel) {
        in_R9 = "Granting Execution";
        sVar10 = 0x12;
LAB_002656f4:
        iVar7 = 0xf;
        goto LAB_002657a2;
      }
      break;
    case ERRORED:
      pcVar8 = (char *)(cmd->payload).bufferSize;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = commandErrorString(0);
        this_00 = &this->errorString;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   pcVar8);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_00,"unknown");
        if (bVar4) {
          CLI::std::__cxx11::to_string(&local_48,cmd->messageID);
          std::operator+(&local_68," code:",&local_48);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_68);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_48);
        }
      }
      else {
        local_68._M_string_length = (size_type)(cmd->payload).heap;
        local_68._M_dataplus._M_p = pcVar8;
        std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&this->errorString,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_68);
      }
      this->errorCode = cmd->messageID;
      in_R9 = (this->errorString)._M_dataplus._M_p;
      sVar10 = (this->errorString)._M_string_length;
      iVar7 = 0;
LAB_002657a2:
      logMessageSource_00._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource_00._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message_00._M_str = in_R9;
      message_00._M_len = sVar10;
      logMessage(this,iVar7,logMessageSource_00,message_00,false);
      break;
    case FINISHED:
      if (0xe < this->maxLogLevel) {
        in_R9 = "Terminating";
        sVar10 = 0xb;
        goto LAB_002656f4;
      }
    }
  }
  MVar5 = (proc_result->
          super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
          super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
          super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl;
  uVar6 = (ushort)(byte)MVar5;
  if (MVar5 == DELAY_MESSAGE) {
    addFederateToDelay(this,(GlobalFederateId)(cmd->source_id).gid);
    uVar9 = 0x100;
    uVar6 = 0xff;
    goto LAB_0026595a;
  }
  if (MVar5 == CONTINUE_PROCESSING) {
    uVar9 = 0;
    goto LAB_0026595a;
  }
  if (MVar5 == REPROCESS_MESSAGE) {
    if ((cmd->dest_id).gid != (this->global_id)._M_i.gid) {
      routeMessage(this,cmd);
      uVar9 = 0x100;
      uVar6 = 0xfe;
      goto LAB_0026595a;
    }
    MVar5 = processActionMessage(this,cmd);
  }
  else {
    if (this->timeGranted_mode == true) {
      pTVar1 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      lVar2 = (pTVar1->time_granted).internalTimeCode;
      (this->time_granted).internalTimeCode = lVar2;
      (this->allowed_send_time).internalTimeCode =
           (pTVar1->info).outputDelay.internalTimeCode + lVar2;
      sVar10 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (cmd->messageAction == cmd_force_time_grant) {
        if (this->ignore_time_mismatch_warnings == false) {
          local_48._M_dataplus._M_p =
               (pointer)((double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000));
          fmt.size_ = 10;
          fmt.data_ = (char *)0x16;
          args.field_1.values_ = (value<fmt::v11::context> *)in_R9;
          args.desc_ = (unsigned_long_long)&local_48;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&local_68,(v11 *)"forced Granted Time={}",fmt,args);
          logMessageSource_01._M_str = _Var3._M_p;
          logMessageSource_01._M_len = sVar10;
          message_01._M_str = local_68._M_dataplus._M_p;
          message_01._M_len = local_68._M_string_length;
          logMessage(this,3,logMessageSource_01,message_01,false);
LAB_00265949:
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
      else if (0xe < this->maxLogLevel) {
        local_48._M_dataplus._M_p =
             (pointer)((double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000));
        fmt_00.size_ = 10;
        fmt_00.data_ = (char *)0xf;
        args_00.field_1.values_ = (value<fmt::v11::context> *)in_R9;
        args_00.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v11::vformat_abi_cxx11_((string *)&local_68,(v11 *)0x348c15,fmt_00,args_00);
        logMessageSource_02._M_str = _Var3._M_p;
        logMessageSource_02._M_len = sVar10;
        message_02._M_str = local_68._M_dataplus._M_p;
        message_02._M_len = local_68._M_string_length;
        logMessage(this,0xf,logMessageSource_02,message_02,false);
        goto LAB_00265949;
      }
    }
    MVar5 = (proc_result->
            super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
            super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
            super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl;
  }
  uVar6 = (ushort)(byte)MVar5;
  uVar9 = 0x100;
LAB_0026595a:
  return (_Optional_base<helics::MessageProcessingResult,_true,_true>)(uVar9 | uVar6);
}

Assistant:

std::optional<MessageProcessingResult> FederateState::checkProcResult(
    std::tuple<FederateStates, MessageProcessingResult, bool>& proc_result,
    ActionMessage& cmd)
{
    timeGranted_mode = std::get<2>(proc_result);

    if (getState() != std::get<0>(proc_result)) {
        setState(std::get<0>(proc_result));
        switch (std::get<0>(proc_result)) {
            case FederateStates::INITIALIZING:
                LOG_TIMING("Granting Initialization");
                if (checkInterfaces() != defs::Errors::OK) {
                    setState(FederateStates::ERRORED);
                    return MessageProcessingResult::ERROR_RESULT;
                }
                timeCoord->enterInitialization();
                break;
            case FederateStates::EXECUTING:
                timeCoord->updateTimeFactors();
                LOG_TIMING("Granting Execution");
                break;
            case FederateStates::FINISHED:
                LOG_TIMING("Terminating");
                break;
            case FederateStates::ERRORED:
                if (cmd.payload.empty()) {
                    errorString = commandErrorString(cmd.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(cmd.messageID);
                    }
                } else {
                    errorString = cmd.payload.to_string();
                }
                errorCode = cmd.messageID;
                LOG_ERROR(errorString);
                break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (cmd.dest_id != global_id.load()) {
                routeMessage(cmd);
                return MessageProcessingResult::CONTINUE_PROCESSING;
            }
            return processActionMessage(cmd);
        case MessageProcessingResult::DELAY_MESSAGE:
            addFederateToDelay(GlobalFederateId(cmd.source_id));
            return MessageProcessingResult::DELAY_MESSAGE;
        default:
            if (timeGranted_mode) {
                time_granted = timeCoord->getGrantedTime();
                allowed_send_time = timeCoord->allowedSendTime();
                if (cmd.action() == CMD_FORCE_TIME_GRANT) {
                    if (!ignore_time_mismatch_warnings) {
                        LOG_WARNING(fmt::format("forced Granted Time={}",
                                                static_cast<double>(time_granted)));
                    }
                } else {
                    LOG_TIMING(fmt::format("Granted Time={}", static_cast<double>(time_granted)));
                }
            }
            return (std::get<1>(proc_result));
    }
    return std::nullopt;
}